

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftpserver.c
# Opt level: O2

void uss_realpath(SftpServer *srv,SftpReplyBuilder *reply,ptrlen path)

{
  char *__name;
  char *str;
  SftpReplyBuilder *reply_00;
  ptrlen pVar1;
  
  __name = mkstr(path);
  reply_00 = (SftpReplyBuilder *)0x0;
  str = realpath(__name,(char *)0x0);
  free(__name);
  if (str != (char *)0x0) {
    pVar1 = ptrlen_from_asciz(str);
    (*reply->vt->reply_simple_name)(reply,pVar1);
    free(str);
    return;
  }
  uss_error((UnixSftpServer *)reply,reply_00);
  return;
}

Assistant:

static void uss_realpath(SftpServer *srv, SftpReplyBuilder *reply,
                         ptrlen path)
{
    UnixSftpServer *uss = container_of(srv, UnixSftpServer, srv);

    char *inpath = mkstr(path);
    char *outpath = realpath(inpath, NULL);
    free(inpath);

    if (!outpath) {
        uss_error(uss, reply);
    } else {
        fxp_reply_simple_name(reply, ptrlen_from_asciz(outpath));
        free(outpath);
    }
}